

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLParser.cpp
# Opt level: O3

bool __thiscall llvm::yaml::Scanner::fetchMoreTokens(Scanner *this)

{
  byte *pbVar1;
  uint uVar2;
  bool bVar3;
  size_type sVar4;
  byte *pbVar5;
  ulong uVar6;
  byte bVar7;
  StringRef Chars;
  Twine local_40;
  undefined1 local_28 [8];
  StringRef FirstChar;
  
  if (this->IsStartOfStream == true) {
    scanStreamStart(this);
    return true;
  }
  scanToNextToken(this);
  if (this->Current == this->End) {
    scanStreamEnd(this);
    return true;
  }
  removeStaleSimpleKeyCandidates(this);
  unrollIndent(this,this->Column);
  pbVar5 = (byte *)this->Current;
  bVar7 = *pbVar5;
  if (this->Column == 0) {
    if (bVar7 == 0x25) {
      bVar3 = scanDirective(this);
      return bVar3;
    }
    if (this->End < pbVar5 + 4) goto LAB_00b301d0;
    if (0x3e < bVar7) goto LAB_00b30260;
    switch(bVar7) {
    case 0x21:
      goto switchD_00b30249_caseD_21;
    case 0x22:
    case 0x23:
    case 0x24:
    case 0x25:
    case 0x27:
    case 0x28:
    case 0x29:
    case 0x2b:
      goto switchD_00b301f3_caseD_27;
    case 0x26:
      goto switchD_00b301f3_caseD_26;
    case 0x2a:
      goto switchD_00b301f3_caseD_2a;
    case 0x2c:
      goto switchD_00b301f3_caseD_2c;
    case 0x2d:
      if (((pbVar5[1] == 0x2d) && (pbVar5[2] == 0x2d)) &&
         (((ulong)pbVar5[3] < 0x21 && ((0x100002600U >> ((ulong)pbVar5[3] & 0x3f) & 1) != 0)))) {
        bVar3 = true;
LAB_00b30467:
        scanDocumentIndicator(this,bVar3);
        return true;
      }
      goto switchD_00b301f3_caseD_2d;
    case 0x2e:
      if ((((pbVar5[1] == 0x2e) && (pbVar5[2] == 0x2e)) && ((ulong)pbVar5[3] < 0x21)) &&
         ((0x100002600U >> ((ulong)pbVar5[3] & 0x3f) & 1) != 0)) {
        bVar3 = false;
        goto LAB_00b30467;
      }
      break;
    default:
      goto switchD_00b30249_default;
    }
  }
  else {
LAB_00b301d0:
    if (bVar7 < 0x3f) {
      switch(bVar7) {
      case 0x26:
switchD_00b301f3_caseD_26:
        bVar3 = false;
LAB_00b30253:
        bVar3 = scanAliasOrAnchor(this,bVar3);
        return bVar3;
      case 0x27:
      case 0x28:
      case 0x29:
      case 0x2b:
switchD_00b301f3_caseD_27:
        if (bVar7 == 0x3e) {
          uVar2 = this->FlowLevel;
          goto joined_r0x00b30387;
        }
        break;
      case 0x2a:
switchD_00b301f3_caseD_2a:
        bVar3 = true;
        goto LAB_00b30253;
      case 0x2c:
switchD_00b301f3_caseD_2c:
        scanFlowEntry(this);
        return true;
      case 0x2d:
switchD_00b301f3_caseD_2d:
        if ((((byte *)this->End != pbVar5 + 1) && (uVar6 = (ulong)pbVar5[1], uVar6 < 0x21)) &&
           ((0x100002600U >> (uVar6 & 0x3f) & 1) != 0)) {
          scanBlockEntry(this);
          return true;
        }
        break;
      default:
        if (bVar7 == 0x21) {
switchD_00b30249_caseD_21:
          bVar3 = scanTag(this);
          return bVar3;
        }
switchD_00b30249_default:
        if (bVar7 != 0x3a) goto switchD_00b301f3_caseD_27;
        if ((this->FlowLevel != 0) ||
           ((((byte *)this->End != pbVar5 + 1 && (uVar6 = (ulong)pbVar5[1], uVar6 < 0x21)) &&
            ((0x100002600U >> (uVar6 & 0x3f) & 1) != 0)))) {
          bVar3 = scanValue(this);
          return bVar3;
        }
      }
    }
    else {
LAB_00b30260:
      if (bVar7 < 0x7b) {
        if (bVar7 != 0x3f) {
          if (bVar7 == 0x5b) {
            bVar3 = true;
            goto LAB_00b30379;
          }
          if (bVar7 == 0x5d) {
            bVar3 = true;
            goto LAB_00b302a6;
          }
          goto switchD_00b301f3_caseD_27;
        }
        if ((this->FlowLevel != 0) ||
           ((((byte *)this->End != pbVar5 + 1 && (uVar6 = (ulong)pbVar5[1], uVar6 < 0x21)) &&
            ((0x100002600U >> (uVar6 & 0x3f) & 1) != 0)))) {
          scanKey(this);
          return true;
        }
        goto LAB_00b30416;
      }
      if (bVar7 == 0x7b) {
        bVar3 = false;
LAB_00b30379:
        scanFlowCollectionStart(this,bVar3);
        return true;
      }
      if (bVar7 != 0x7c) {
        if (bVar7 == 0x7d) {
          bVar3 = false;
LAB_00b302a6:
          scanFlowCollectionEnd(this,bVar3);
          return true;
        }
        goto switchD_00b301f3_caseD_27;
      }
      uVar2 = this->FlowLevel;
joined_r0x00b30387:
      if (uVar2 == 0) {
        bVar3 = scanBlockScalar(this,false);
        return bVar3;
      }
    }
LAB_00b30416:
    if (bVar7 == 0x22) {
      bVar3 = true;
LAB_00b3042f:
      bVar3 = scanFlowScalar(this,bVar3);
      return bVar3;
    }
    if (bVar7 == 0x27) {
      bVar3 = false;
      goto LAB_00b3042f;
    }
  }
  FirstChar.Data = &DAT_00000001;
  local_28 = (undefined1  [8])pbVar5;
  if ((((byte *)this->End == pbVar5) || (0x20 < bVar7)) ||
     ((0x100002600U >> ((ulong)bVar7 & 0x3f) & 1) == 0)) {
    Chars.Length = 0x13;
    Chars.Data = "-?:,[]{}#&*!|>\'\"%@`";
    sVar4 = StringRef::find_first_of((StringRef *)local_28,Chars,0);
    if (sVar4 != 0xffffffffffffffff) {
      pbVar5 = (byte *)this->Current;
      bVar7 = *pbVar5;
      if ((bVar7 != 0x2d) ||
         ((((byte *)this->End != pbVar5 + 1 && (uVar6 = (ulong)pbVar5[1], uVar6 < 0x21)) &&
          (bVar7 = 0x2d, (0x100002600U >> (uVar6 & 0x3f) & 1) != 0)))) goto LAB_00b304ef;
    }
LAB_00b30551:
    bVar3 = scanPlainScalar(this);
  }
  else {
LAB_00b304ef:
    if ((this->FlowLevel == 0) && ((bVar7 == 0x3f || (bVar7 == 0x3a)))) {
      pbVar1 = pbVar5 + 1;
      if ((((byte *)this->End != pbVar1) &&
          (((ulong)*pbVar1 < 0x21 && ((0x100002600U >> ((ulong)*pbVar1 & 0x3f) & 1) != 0)))) ||
         ((bVar7 == 0x3a &&
          (((pbVar5 + 2 < this->End && (*pbVar1 == 0x3a)) &&
           ((uVar6 = (ulong)pbVar5[2], 0x20 < uVar6 || ((0x100002600U >> (uVar6 & 0x3f) & 1) == 0)))
           ))))) goto LAB_00b30551;
    }
    Twine::Twine(&local_40,"Unrecognized character while tokenizing.");
    setError(this,&local_40,this->Current);
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool Scanner::fetchMoreTokens() {
  if (IsStartOfStream)
    return scanStreamStart();

  scanToNextToken();

  if (Current == End)
    return scanStreamEnd();

  removeStaleSimpleKeyCandidates();

  unrollIndent(Column);

  if (Column == 0 && *Current == '%')
    return scanDirective();

  if (Column == 0 && Current + 4 <= End
      && *Current == '-'
      && *(Current + 1) == '-'
      && *(Current + 2) == '-'
      && (Current + 3 == End || isBlankOrBreak(Current + 3)))
    return scanDocumentIndicator(true);

  if (Column == 0 && Current + 4 <= End
      && *Current == '.'
      && *(Current + 1) == '.'
      && *(Current + 2) == '.'
      && (Current + 3 == End || isBlankOrBreak(Current + 3)))
    return scanDocumentIndicator(false);

  if (*Current == '[')
    return scanFlowCollectionStart(true);

  if (*Current == '{')
    return scanFlowCollectionStart(false);

  if (*Current == ']')
    return scanFlowCollectionEnd(true);

  if (*Current == '}')
    return scanFlowCollectionEnd(false);

  if (*Current == ',')
    return scanFlowEntry();

  if (*Current == '-' && isBlankOrBreak(Current + 1))
    return scanBlockEntry();

  if (*Current == '?' && (FlowLevel || isBlankOrBreak(Current + 1)))
    return scanKey();

  if (*Current == ':' && (FlowLevel || isBlankOrBreak(Current + 1)))
    return scanValue();

  if (*Current == '*')
    return scanAliasOrAnchor(true);

  if (*Current == '&')
    return scanAliasOrAnchor(false);

  if (*Current == '!')
    return scanTag();

  if (*Current == '|' && !FlowLevel)
    return scanBlockScalar(true);

  if (*Current == '>' && !FlowLevel)
    return scanBlockScalar(false);

  if (*Current == '\'')
    return scanFlowScalar(false);

  if (*Current == '"')
    return scanFlowScalar(true);

  // Get a plain scalar.
  StringRef FirstChar(Current, 1);
  if (!(isBlankOrBreak(Current)
        || FirstChar.find_first_of("-?:,[]{}#&*!|>'\"%@`") != StringRef::npos)
      || (*Current == '-' && !isBlankOrBreak(Current + 1))
      || (!FlowLevel && (*Current == '?' || *Current == ':')
          && isBlankOrBreak(Current + 1))
      || (!FlowLevel && *Current == ':'
                      && Current + 2 < End
                      && *(Current + 1) == ':'
                      && !isBlankOrBreak(Current + 2)))
    return scanPlainScalar();

  setError("Unrecognized character while tokenizing.");
  return false;
}